

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenDefaultBufferValue_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  BaseType BVar2;
  bool bVar3;
  Type *type;
  char *__s;
  string suffix;
  string field_name;
  allocator<char> local_59;
  string local_58;
  string local_38 [32];
  
  BVar1 = (field->value).type.base_type;
  std::__cxx11::string::string(local_38,(string *)field);
  if (BVar1 - BASE_TYPE_UTYPE < 0xc) {
    LiteralSuffix_abi_cxx11_(&local_58,(KotlinKMPGenerator *)&field->value,type);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  }
  BVar2 = (field->value).type.base_type;
  if ((BVar2 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"null",&local_59);
  }
  else if (BVar1 - BASE_TYPE_FLOAT < 2) {
    FloatConstantGenerator::GenFloatConstant_abi_cxx11_
              (__return_storage_ptr__,
               (FloatConstantGenerator *)(anonymous_namespace)::KotlinFloatGen,field);
    if ((BVar1 == BASE_TYPE_DOUBLE) &&
       ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
        'f')) {
      std::__cxx11::string::pop_back();
    }
  }
  else if (BVar1 == BASE_TYPE_BOOL) {
    bVar3 = std::operator==(&(field->value).constant,"0");
    __s = "true";
    if (bVar3) {
      __s = "false";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_59);
  }
  else if (((BVar2 - BASE_TYPE_UTYPE < 10) && ((field->value).type.enum_def != (EnumDef *)0x0)) ||
          ((BVar1 = (field->value).type.element,
           BVar1 != BASE_TYPE_UTYPE || (BVar2 - BASE_TYPE_VECTOR & 0xfffffffb) != 0 &&
           (((BVar2 != BASE_TYPE_VECTOR64 && (BVar2 != BASE_TYPE_VECTOR)) ||
            (BVar1 != BASE_TYPE_UNION)))))) {
    std::operator+(__return_storage_ptr__,&(field->value).constant,&local_58);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&(field->value).constant);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GenDefaultBufferValue(const FieldDef &field) const {
    auto &value = field.value;
    auto base_type = value.type.base_type;
    auto field_name = field.name;
    std::string suffix = IsScalar(base_type) ? LiteralSuffix(value.type) : "";
    if (field.IsScalarOptional()) { return "null"; }
    if (IsFloat(base_type)) {
      auto val = KotlinFloatGen.GenFloatConstant(field);
      if (base_type == BASE_TYPE_DOUBLE && val.back() == 'f') {
        val.pop_back();
      }
      return val;
    }

    if (base_type == BASE_TYPE_BOOL) {
      return value.constant == "0" ? "false" : "true";
    }

    if (IsEnum(field.value.type)) {
      return value.constant + suffix;
    } else if ((IsVector(field.value.type) &&
                field.value.type.element == BASE_TYPE_UTYPE) ||
               (IsVector(field.value.type) &&
                field.value.type.VectorType().base_type == BASE_TYPE_UNION)) {
      return value.constant;
    } else {
      return value.constant + suffix;
    }
  }